

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

void Saig_StrSimulateNode(Aig_Obj_t *pObj,int i)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  uint *pSims1;
  uint *pSims0;
  uint *pSims;
  int i_local;
  Aig_Obj_t *pObj_local;
  
  pvVar1 = (pObj->field_5).pData;
  pAVar5 = Aig_ObjFanin0(pObj);
  pvVar2 = (pAVar5->field_5).pData;
  pAVar5 = Aig_ObjFanin1(pObj);
  pvVar3 = (pAVar5->field_5).pData;
  iVar4 = Aig_ObjFaninC0(pObj);
  if ((iVar4 == 0) || (iVar4 = Aig_ObjFaninC1(pObj), iVar4 == 0)) {
    iVar4 = Aig_ObjFaninC0(pObj);
    if ((iVar4 == 0) || (iVar4 = Aig_ObjFaninC1(pObj), iVar4 != 0)) {
      iVar4 = Aig_ObjFaninC0(pObj);
      if ((iVar4 == 0) && (iVar4 = Aig_ObjFaninC1(pObj), iVar4 != 0)) {
        *(uint *)((long)pvVar1 + (long)i * 4) =
             *(uint *)((long)pvVar2 + (long)i * 4) &
             (*(uint *)((long)pvVar3 + (long)i * 4) ^ 0xffffffff);
      }
      else {
        *(uint *)((long)pvVar1 + (long)i * 4) =
             *(uint *)((long)pvVar2 + (long)i * 4) & *(uint *)((long)pvVar3 + (long)i * 4);
      }
    }
    else {
      *(uint *)((long)pvVar1 + (long)i * 4) =
           (*(uint *)((long)pvVar2 + (long)i * 4) ^ 0xffffffff) &
           *(uint *)((long)pvVar3 + (long)i * 4);
    }
  }
  else {
    *(uint *)((long)pvVar1 + (long)i * 4) =
         (*(uint *)((long)pvVar2 + (long)i * 4) | *(uint *)((long)pvVar3 + (long)i * 4)) ^
         0xffffffff;
  }
  return;
}

Assistant:

void Saig_StrSimulateNode( Aig_Obj_t * pObj, int i )
{
    unsigned * pSims  = (unsigned *)pObj->pData;
    unsigned * pSims0 = (unsigned *)Aig_ObjFanin0(pObj)->pData;
    unsigned * pSims1 = (unsigned *)Aig_ObjFanin1(pObj)->pData;
    if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        pSims[i] = ~(pSims0[i] | pSims1[i]);
    else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        pSims[i] = (~pSims0[i] & pSims1[i]);
    else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        pSims[i] = (pSims0[i] & ~pSims1[i]);
    else // if ( !Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        pSims[i] = (pSims0[i] & pSims1[i]);
}